

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O1

int __thiscall
TPZSFMatrix<long_double>::Resize(TPZSFMatrix<long_double> *this,int64_t newDim,int64_t param_2)

{
  longdouble lVar1;
  longdouble *plVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  longdouble *plVar4;
  longdouble *plVar5;
  longdouble *plVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar3 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if (CONCAT44(extraout_var,iVar3) != newDim) {
    uVar7 = ((newDim + 1) * newDim) / 2;
    iVar3 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x4b])();
    plVar4 = (longdouble *)operator_new__(-(ulong)(uVar7 >> 0x3c != 0) | uVar7 * 0x10);
    uVar8 = uVar7;
    if ((long)CONCAT44(extraout_var_00,iVar3) <= (long)uVar7) {
      uVar8 = CONCAT44(extraout_var_00,iVar3);
    }
    plVar2 = this->fElem;
    plVar5 = plVar4;
    if (0 < (long)uVar8) {
      plVar6 = plVar2;
      do {
        lVar1 = *plVar6;
        plVar6 = plVar6 + 1;
        *plVar5 = lVar1;
        plVar5 = plVar5 + 1;
      } while (plVar6 < plVar2 + uVar8);
    }
    if (plVar5 < plVar4 + uVar7) {
      do {
        *plVar5 = (longdouble)0;
        plVar5 = plVar5 + 1;
      } while (plVar5 < plVar4 + uVar7);
    }
    if (plVar2 != (longdouble *)0x0) {
      operator_delete(plVar2,0x10);
    }
    this->fElem = plVar4;
    (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = newDim;
    (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = newDim;
    (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  }
  return 1;
}

Assistant:

int
TPZSFMatrix<TVar> ::Resize( int64_t newDim , int64_t )
{
	if ( newDim == this->Dim() )
		return( 1 );
	
	int64_t newSize = newDim * (newDim + 1) / 2;
	int64_t oldSize = Size();
	TVar *newElem = new TVar[newSize] ;
	if ( newElem == NULL )
		return TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Resize <memory allocation error>." );
	
	int64_t minSize  = Min( newSize, oldSize );
	TVar *src = fElem;
	TVar *dst = newElem;
	TVar *end = &fElem[ minSize ];
	
	// Copia os elementos antigos para a nova matriz.
	while ( src < end )
		*dst++ = *src++;
	
	// Preenche os elementos que sobrarem (se sobrarem) com ZEROS.
	end = &newElem[ newSize ];
	while ( dst < end )
		*dst++ = 0.0;
	
	if ( fElem != NULL )
		delete( fElem );
	fElem = newElem;
	this->fRow = this->fCol = newDim;
	this->fDecomposed = 0;
	return( 1 );
}